

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::Constraint::getUpperBound(Constraint *this,VectorDynSize *upperBound)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  
  bVar1 = this->m_isUpperBounded;
  if (bVar1 == true) {
    lVar2 = iDynTree::VectorDynSize::size();
    lVar3 = iDynTree::VectorDynSize::size();
    if (lVar2 != lVar3) {
      iDynTree::VectorDynSize::size();
      iDynTree::VectorDynSize::resize((ulong)upperBound);
    }
    iDynTree::VectorDynSize::operator=(upperBound,&this->m_upperBound);
  }
  return bVar1;
}

Assistant:

bool Constraint::getUpperBound(VectorDynSize &upperBound)
        {
            if (!m_isUpperBounded) {
                    return false;
            }
            if (upperBound.size() != m_upperBound.size()) {
                upperBound.resize(m_upperBound.size());
            }
            upperBound = m_upperBound;
            return true;
        }